

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double cardioid_cdf(double x,double a,double b)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (a + -3.141592653589793 < x) {
    if (a + 3.141592653589793 <= x) {
      dVar1 = 1.0;
    }
    else {
      dVar1 = sin(x - a);
      dVar1 = (dVar1 * (b + b) + ((x + 3.141592653589793) - a)) / 6.283185307179586;
    }
  }
  return dVar1;
}

Assistant:

double cardioid_cdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    CARDIOID_CDF evaluates the Cardioid CDF.
//
//  Discussion:
//
//    The angle X is assumed to lie between A - PI and A + PI.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 July 2005
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 <= B <= 0.5.
//
//    Output, double CDF, the value of the PDF.
//
{
  double cdf;
  const double r8_pi = 3.14159265358979323;

  if ( x <= a - r8_pi )
  {
    cdf = 0.0;
  }
  else if ( x < a + r8_pi )
  {
    cdf = ( r8_pi + x - a + 2.0 * b * sin ( x - a ) ) / ( 2.0 * r8_pi );
  }
  else
  {
    cdf = 1.0;
  }

  return cdf;
}